

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

ON_SHA1_Hash * __thiscall
ON_DimStyle::TextPositionPropertiesHash(ON_SHA1_Hash *__return_storage_ptr__,ON_DimStyle *this)

{
  ON_SHA1_Hash *this_00;
  LengthUnitSystem LVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  ON__UINT32 u;
  ON_SHA1_Hash *pOVar5;
  ON_Font *this_01;
  ON_SHA1_Hash font_hash;
  ON_SHA1 sha1;
  ON_SHA1_Hash local_e8;
  ON_SHA1_Hash local_cc;
  ON_SHA1 local_b8;
  
  this_00 = &this->m_text_position_properties_hash;
  bVar4 = ON_SHA1_Hash::IsEmptyContentHash(this_00);
  if (bVar4) {
    local_b8.m_state[2] = 0;
    local_b8.m_state[3] = 0;
    local_b8.m_state[4] = 0;
    local_b8.m_bit_count[0] = 0;
    local_b8.m_bit_count[1] = 0;
    local_b8.m_state[0] = 0;
    local_b8.m_state[1] = 0;
    local_b8.m_buffer[0x30] = '\0';
    local_b8.m_buffer[0x31] = '\0';
    local_b8.m_buffer[0x32] = '\0';
    local_b8.m_buffer[0x33] = '\0';
    local_b8.m_buffer[0x34] = '\0';
    local_b8.m_buffer[0x35] = '\0';
    local_b8.m_buffer[0x36] = '\0';
    local_b8.m_buffer[0x37] = '\0';
    local_b8.m_buffer[0x38] = '\0';
    local_b8.m_buffer[0x39] = '\0';
    local_b8.m_buffer[0x3a] = '\0';
    local_b8.m_buffer[0x3b] = '\0';
    local_b8.m_buffer[0x3c] = '\0';
    local_b8.m_buffer[0x3d] = '\0';
    local_b8.m_buffer[0x3e] = '\0';
    local_b8.m_buffer[0x3f] = '\0';
    local_b8.m_buffer[0x20] = '\0';
    local_b8.m_buffer[0x21] = '\0';
    local_b8.m_buffer[0x22] = '\0';
    local_b8.m_buffer[0x23] = '\0';
    local_b8.m_buffer[0x24] = '\0';
    local_b8.m_buffer[0x25] = '\0';
    local_b8.m_buffer[0x26] = '\0';
    local_b8.m_buffer[0x27] = '\0';
    local_b8.m_buffer[0x28] = '\0';
    local_b8.m_buffer[0x29] = '\0';
    local_b8.m_buffer[0x2a] = '\0';
    local_b8.m_buffer[0x2b] = '\0';
    local_b8.m_buffer[0x2c] = '\0';
    local_b8.m_buffer[0x2d] = '\0';
    local_b8.m_buffer[0x2e] = '\0';
    local_b8.m_buffer[0x2f] = '\0';
    local_b8.m_buffer[0x10] = '\0';
    local_b8.m_buffer[0x11] = '\0';
    local_b8.m_buffer[0x12] = '\0';
    local_b8.m_buffer[0x13] = '\0';
    local_b8.m_buffer[0x14] = '\0';
    local_b8.m_buffer[0x15] = '\0';
    local_b8.m_buffer[0x16] = '\0';
    local_b8.m_buffer[0x17] = '\0';
    local_b8.m_buffer[0x18] = '\0';
    local_b8.m_buffer[0x19] = '\0';
    local_b8.m_buffer[0x1a] = '\0';
    local_b8.m_buffer[0x1b] = '\0';
    local_b8.m_buffer[0x1c] = '\0';
    local_b8.m_buffer[0x1d] = '\0';
    local_b8.m_buffer[0x1e] = '\0';
    local_b8.m_buffer[0x1f] = '\0';
    local_b8.m_buffer[0] = '\0';
    local_b8.m_buffer[1] = '\0';
    local_b8.m_buffer[2] = '\0';
    local_b8.m_buffer[3] = '\0';
    local_b8.m_buffer[4] = '\0';
    local_b8.m_buffer[5] = '\0';
    local_b8.m_buffer[6] = '\0';
    local_b8.m_buffer[7] = '\0';
    local_b8.m_buffer[8] = '\0';
    local_b8.m_buffer[9] = '\0';
    local_b8.m_buffer[10] = '\0';
    local_b8.m_buffer[0xb] = '\0';
    local_b8.m_buffer[0xc] = '\0';
    local_b8.m_buffer[0xd] = '\0';
    local_b8.m_buffer[0xe] = '\0';
    local_b8.m_buffer[0xf] = '\0';
    local_b8.m_byte_count = 0;
    local_b8.m_status_bits = 0;
    local_b8.m_reserved = 0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
    this_01 = &this->m_font_characteristics;
    if (this->m_managed_font != (ON_Font *)0x0) {
      this_01 = this->m_managed_font;
    }
    pOVar5 = ON_Font::FontCharacteristicsHash(this_01);
    local_e8.m_digest._0_8_ = *(undefined8 *)pOVar5->m_digest;
    local_e8.m_digest._8_8_ = *(undefined8 *)(pOVar5->m_digest + 8);
    local_e8.m_digest._16_4_ = *(undefined4 *)(pOVar5->m_digest + 0x10);
    ON_SHA1::AccumulateSubHash(&local_b8,&local_e8);
    dVar2 = ON_ScaleValue::RightToLeftScale(&this->m_scale_value);
    ON_SHA1::AccumulateDouble(&local_b8,dVar2);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_extextension);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_extoffset);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_textheight);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_dim_text_location);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_dimradial_text_location);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_angleformat);
    ON_SHA1::AccumulateUnsigned32(&local_b8,this->m_dimension_length_display);
    ON_SHA1::AccumulateUnsigned32(&local_b8,this->m_alternate_dimension_length_display);
    ON_SHA1::AccumulateInteger32(&local_b8,this->m_angleresolution);
    ON_SHA1::AccumulateInteger32(&local_b8,this->m_lengthresolution);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_lengthfactor);
    ON_SHA1::AccumulateBool(&local_b8,this->m_bAlternate);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_alternate_lengthfactor);
    ON_SHA1::AccumulateInteger32(&local_b8,this->m_alternate_lengthresolution);
    ON_wString::IsValid(&this->m_prefix,true);
    ON_SHA1::AccumulateString(&local_b8,&this->m_prefix);
    ON_wString::IsValid(&this->m_suffix,true);
    ON_SHA1::AccumulateString(&local_b8,&this->m_suffix);
    ON_wString::IsValid(&this->m_alternate_prefix,true);
    ON_SHA1::AccumulateString(&local_b8,&this->m_alternate_prefix);
    ON_wString::IsValid(&this->m_alternate_suffix,true);
    ON_SHA1::AccumulateString(&local_b8,&this->m_alternate_suffix);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_dimextension);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_tolerance_format);
    ON_SHA1::AccumulateInteger32(&local_b8,this->m_tolerance_resolution);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_tolerance_upper_value);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_tolerance_lower_value);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_tolerance_height_scale);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_text_rotation);
    ON_SHA1::AccumulateInteger32(&local_b8,this->m_alternate_tolerance_resolution);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_tol_textheight_fraction);
    ON_SHA1::AccumulateInteger32(&local_b8,this->m_textmove_leader);
    ON_SHA1::AccumulateInteger32(&local_b8,this->m_arclength_sym);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_stack_textheight_fraction);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_stack_format);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_alt_round);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_round);
    ON_SHA1::AccumulateDouble(&local_b8,this->m_angular_round);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_alt_zero_suppress);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_zero_suppress);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_ang_zero_suppress);
    ON_SHA1::AccumulateBool(&local_b8,this->m_alt_below);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_text_vertical_alignment);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_text_horizontal_alignment);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_leader_text_vertical_alignment);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_leader_text_horizontal_alignment);
    dVar2 = ON_ScaleValue::LeftToRightScale(&this->m_scale_value);
    ON_SHA1::AccumulateDouble(&local_b8,dVar2);
    LVar1 = this->m_dimstyle_unitsystem;
    u = 0;
    if ((LVar1 != CustomUnits) && (u = 0, LVar1 != Unset)) {
      u = (ON__UINT32)LVar1;
    }
    ON_SHA1::AccumulateUnsigned32(&local_b8,u);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_text_orientation);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_leader_text_orientation);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_dim_text_orientation);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_dimradial_text_orientation);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_dim_text_angle_style);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_dimradial_text_angle_style);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_text_underlined);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_ArrowFit);
    ON_SHA1::AccumulateUnsigned32(&local_b8,(uint)this->m_TextFit);
    ON_SHA1::AccumulateUnsigned32(&local_b8,this->m_decimal_separator);
    ON_SHA1::Hash(&local_cc,&local_b8);
    *(undefined4 *)((this->m_text_position_properties_hash).m_digest + 0x10) =
         local_cc.m_digest._16_4_;
    *(undefined8 *)this_00->m_digest = local_cc.m_digest._0_8_;
    *(undefined8 *)((this->m_text_position_properties_hash).m_digest + 8) = local_cc.m_digest._8_8_;
  }
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
       *(undefined4 *)((this->m_text_position_properties_hash).m_digest + 0x10);
  uVar3 = *(undefined8 *)((this->m_text_position_properties_hash).m_digest + 8);
  *(undefined8 *)__return_storage_ptr__->m_digest = *(undefined8 *)this_00->m_digest;
  *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = uVar3;
  return __return_storage_ptr__;
}

Assistant:

const class ON_SHA1_Hash ON_DimStyle::TextPositionPropertiesHash() const
{
  // sha1 hash of properties that have any possible effect on annotation text appearance, size, shape
  if (m_text_position_properties_hash.IsEmptyContentHash())
  {
    ON_SHA1 sha1;
    
    const ON_SHA1_Hash font_hash
      = nullptr != m_managed_font
      ? m_managed_font->FontCharacteristicsHash()
      : m_font_characteristics.FontCharacteristicsHash();
    sha1.AccumulateSubHash(font_hash);
    sha1.AccumulateDouble(DimScale());
    sha1.AccumulateDouble(m_extextension);
    sha1.AccumulateDouble(m_extoffset);
    sha1.AccumulateDouble(m_textheight);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dim_text_location));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dimradial_text_location));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_angleformat));

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dimension_length_display));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_alternate_dimension_length_display));

    sha1.AccumulateInteger32(m_angleresolution);
    sha1.AccumulateInteger32(m_lengthresolution);
    sha1.AccumulateDouble(m_lengthfactor);
    sha1.AccumulateBool(m_bAlternate);
    sha1.AccumulateDouble(m_alternate_lengthfactor);
    sha1.AccumulateInteger32(m_alternate_lengthresolution);

    m_prefix.IsValid(true);
    sha1.AccumulateString(m_prefix);

    m_suffix.IsValid(true);
    sha1.AccumulateString(m_suffix);

    m_alternate_prefix.IsValid(true);
    sha1.AccumulateString(m_alternate_prefix);

    m_alternate_suffix.IsValid(true);
    sha1.AccumulateString(m_alternate_suffix);

    sha1.AccumulateDouble(m_dimextension);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_tolerance_format));
    sha1.AccumulateInteger32(m_tolerance_resolution);
    sha1.AccumulateDouble(m_tolerance_upper_value);
    sha1.AccumulateDouble(m_tolerance_lower_value);
    sha1.AccumulateDouble(m_tolerance_height_scale);
    sha1.AccumulateDouble(m_text_rotation);
    sha1.AccumulateInteger32(m_alternate_tolerance_resolution);
    sha1.AccumulateDouble(m_tol_textheight_fraction);
    sha1.AccumulateInteger32(m_textmove_leader);
    sha1.AccumulateInteger32(m_arclength_sym);
    sha1.AccumulateDouble(m_stack_textheight_fraction);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_stack_format));
    sha1.AccumulateDouble(m_alt_round);
    sha1.AccumulateDouble(m_round);
    sha1.AccumulateDouble(m_angular_round);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_alt_zero_suppress));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_zero_suppress));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_ang_zero_suppress));
    sha1.AccumulateBool(m_alt_below);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_text_vertical_alignment));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_text_horizontal_alignment));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_text_vertical_alignment));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_text_horizontal_alignment));
    sha1.AccumulateDouble(m_scale_value.LeftToRightScale());

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(this->UnitSystem()));

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_text_orientation));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_text_orientation));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dim_text_orientation));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dimradial_text_orientation));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dim_text_angle_style));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_dimradial_text_angle_style));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_text_underlined));
    
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_ArrowFit));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_TextFit));

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_decimal_separator));

    // Save hash in mutable m_text_position_properties_hash
    m_text_position_properties_hash = sha1.Hash();
  }
  return m_text_position_properties_hash;
}